

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::Scrollbar(ImGuiLayoutType direction)

{
  ImGuiWindow *this;
  ImDrawList *this_00;
  undefined1 auVar1 [12];
  ulong uVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImGuiID IVar5;
  ImU32 IVar6;
  ImVec2 *pIVar7;
  undefined7 extraout_var;
  ImRect *pIVar8;
  undefined1 auVar9 [8];
  char *str;
  ImGuiCol idx;
  int iVar10;
  uint uVar11;
  int iVar13;
  float fVar14;
  int iVar15;
  int iVar16;
  undefined1 auVar12 [16];
  float fVar17;
  undefined8 in_XMM1_Qa;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  float fVar27;
  undefined1 auVar29 [16];
  ImRect IVar31;
  undefined8 uStack_140;
  bool held;
  bool hovered;
  undefined1 local_128 [8];
  ImVec2 aIStack_120 [2];
  float local_10c;
  undefined1 local_108 [8];
  undefined1 auStack_100 [12];
  ImGuiID local_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined8 local_d8;
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [16];
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [16];
  float *local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  ImVec2 local_40;
  ImVec2 local_38;
  undefined1 auVar21 [16];
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  
  pIVar3 = GImGui;
  this = GImGui->CurrentWindow;
  str = "#SCROLLY";
  if (direction == 1) {
    str = "#SCROLLX";
  }
  IVar5 = ImGuiWindow::GetID(this,str,(char *)0x0);
  unique0x10000ed7 = auStack_100;
  bVar4 = (&this->ScrollbarX)[direction == 1];
  local_e8 = 0.0;
  if (bVar4 == true) {
    local_e8 = (pIVar3->Style).ScrollbarSize;
  }
  IVar31 = ImGuiWindow::Rect(this);
  local_98._0_8_ = IVar31.Max;
  local_98._8_8_ = in_XMM1_Qa;
  aIStack_120[0].y = this->WindowBorderSize;
  fVar27 = IVar31.Max.x;
  local_a8 = IVar31.Max.y;
  fStack_a4 = local_a8;
  fStack_a0 = local_a8;
  fStack_9c = local_a8;
  if (direction == 1) {
    local_d8._0_4_ = (this->Pos).x + aIStack_120[0].y;
    local_128._4_4_ = local_a8 - (pIVar3->Style).ScrollbarSize;
    aIStack_120[0].x = (fVar27 - local_e8) - aIStack_120[0].y;
    aIStack_120[0].y = local_a8 - aIStack_120[0].y;
    fVar27 = aIStack_120[0].x;
    fVar14 = aIStack_120[0].y;
    local_128._0_4_ = (float)local_d8;
  }
  else {
    local_128._0_4_ = fVar27 - (pIVar3->Style).ScrollbarSize;
    local_108._0_4_ = (this->Pos).y + aIStack_120[0].y;
    local_c8._4_12_ = local_98._4_12_;
    local_c8._0_4_ = fVar27 - aIStack_120[0].y;
    aIStack_120[0].y = (local_a8 - local_e8) - aIStack_120[0].y;
    local_d8 = CONCAT44(local_d8._4_4_,local_128._0_4_);
    local_b8._4_4_ = local_a8;
    local_b8._0_4_ = aIStack_120[0].y;
    fStack_b0 = local_a8;
    fStack_ac = local_a8;
    aIStack_120[0].x = (float)local_c8._0_4_;
    fVar27 = ImGuiWindow::TitleBarHeight(this);
    fVar14 = 0.0;
    if ((this->Flags & 0x400) != 0) {
      local_10c = fVar27;
      fVar14 = ImGuiWindow::MenuBarHeight(this);
      fVar27 = local_10c;
    }
    local_128._4_4_ = (float)local_108._0_4_ + fVar27 + fVar14;
    fVar27 = (float)local_c8._0_4_;
    fVar14 = (float)local_b8._0_4_;
  }
  if ((0.0 < fVar27 - (float)local_d8) && (0.0 < fVar14 - (float)local_128._4_4_)) {
    if (direction == 1) {
      iVar10 = (uint)(bVar4 ^ 1) * 8 + 4;
      local_d8 = 0x20;
      uStack_140 = 0x30;
    }
    else {
      iVar10 = ((uint)~this->Flags >> 9 & -(this->Flags & 1U) & 2) + (uint)(bVar4 ^ 1) * 8;
      local_d8 = 0x24;
      uStack_140 = 0x34;
    }
    local_108 = (undefined1  [8])uStack_140;
    this_00 = this->DrawList;
    local_ec = IVar5;
    IVar6 = GetColorU32(0xe,1.0);
    ImDrawList::AddRectFilled
              (this_00,(ImVec2 *)local_128,aIStack_120,IVar6,this->WindowRounding,iVar10);
    IVar5 = local_ec;
    iVar10 = (int)(((aIStack_120[0].x - (float)local_128._0_4_) + -2.0) * 0.5);
    iVar13 = (int)(((aIStack_120[0].y - (float)local_128._4_4_) + -2.0) * 0.5);
    iVar15 = (int)(((aIStack_120[0].x - aIStack_120[0].x) + 0.0) * 0.0);
    iVar16 = (int)(((aIStack_120[0].y - aIStack_120[0].y) + 0.0) * 0.0);
    auVar24._0_4_ = -(uint)(iVar10 < 0);
    auVar24._4_4_ = -(uint)(iVar13 < 0);
    auVar24._8_4_ = -(uint)(iVar15 < 0);
    auVar24._12_4_ = -(uint)(iVar16 < 0);
    auVar25._0_4_ = -(uint)(3 < iVar10);
    auVar25._4_4_ = -(uint)(3 < iVar13);
    auVar25._8_4_ = -(uint)(0 < iVar15);
    auVar25._12_4_ = -(uint)(0 < iVar16);
    auVar18._0_8_ = CONCAT44((float)iVar13,(float)iVar10) ^ 0x8000000080000000;
    auVar18._8_4_ = -(float)iVar15;
    auVar18._12_4_ = -(float)iVar16;
    auVar25 = auVar24 & _DAT_001cb6e0 | ~auVar24 & (auVar25 & _DAT_001cb6d0 | ~auVar25 & auVar18);
    fStack_e0 = auVar25._0_4_;
    fVar27 = auVar25._4_4_;
    auVar19._0_8_ = auVar25._0_8_;
    auVar19._8_4_ = fStack_e0;
    auVar19._12_4_ = fVar27;
    local_128._0_4_ = (float)local_128._0_4_ - fStack_e0;
    fVar14 = (float)local_128._4_4_ - fVar27;
    fStack_e0 = aIStack_120[0].x + fStack_e0;
    fStack_e4 = aIStack_120[0].y + fVar27;
    auVar1._4_8_ = auVar19._8_8_;
    auVar1._0_4_ = (float)local_128._4_4_ + fVar27;
    auVar20._0_8_ = auVar1._0_8_ << 0x20;
    auVar20._8_4_ = fStack_e0;
    auVar20._12_4_ = fStack_e4;
    aIStack_120[0] = auVar20._8_8_;
    fVar27 = (float)local_128._0_4_;
    if (direction != 1) {
      fStack_e0 = fStack_e4;
      fVar27 = fVar14;
    }
    fVar27 = fStack_e0 - fVar27;
    fVar23 = *(float *)((long)&this->Name + local_d8) - local_e8;
    fVar17 = *(float *)((long)&this->Name + (long)local_108);
    _local_108 = ZEXT416((uint)fVar17);
    fVar17 = (float)(~-(uint)(fVar23 <= fVar17) & (uint)fVar23 |
                    -(uint)(fVar23 <= fVar17) & (uint)fVar17);
    local_128._4_4_ = fVar14;
    if (fVar17 <= 0.0) {
      __assert_fail("ImMax(win_size_contents_v, win_size_avail_v) > 0.0f",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x1939,"void ImGui::Scrollbar(ImGuiLayoutType)");
    }
    local_80 = &(this->Scroll).y;
    pIVar7 = (ImVec2 *)local_80;
    if (direction == 1) {
      pIVar7 = &this->Scroll;
    }
    if (fVar17 <= 1.0) {
      fVar17 = 1.0;
    }
    fVar26 = (fVar23 / fVar17) * fVar27;
    fVar14 = (pIVar3->Style).GrabMinSize;
    fVar17 = fVar27;
    if (fVar26 <= fVar27) {
      fVar17 = fVar26;
    }
    uVar11 = -(uint)(fVar26 < fVar14);
    local_e8 = (float)(uVar11 & (uint)fVar14 | ~uVar11 & (uint)fVar17);
    local_c8 = ZEXT416((uint)pIVar7->x);
    held = false;
    hovered = false;
    local_10c = (float)pIVar3->ActiveId;
    fStack_dc = fStack_e4;
    fStack_d0 = fStack_e0;
    fStack_cc = fStack_e4;
    _local_b8 = ZEXT416((uint)fVar23);
    local_d8._0_4_ = fVar27;
    local_d8._4_4_ = fStack_e4;
    bVar4 = ButtonBehavior((ImRect *)local_128,local_ec,&hovered,&held,0x2000);
    auVar29._4_4_ = fStack_e4;
    auVar29._0_4_ = local_e8;
    fVar27 = 1.0;
    if (1.0 <= (float)local_108._0_4_ - (float)local_b8._0_4_) {
      fVar27 = (float)local_108._0_4_ - (float)local_b8._0_4_;
    }
    auVar29._8_4_ = fStack_e4;
    auVar29._12_4_ = fStack_dc;
    auVar28._8_8_ = auVar29._8_8_;
    auVar28._4_4_ = local_c8._0_4_;
    auVar28._0_4_ = local_e8;
    auVar30._0_12_ = auVar28._0_12_;
    auVar30._12_4_ = local_c8._4_4_;
    auVar12._4_4_ = fVar27;
    auVar12._0_4_ = (float)local_d8;
    auVar12._8_4_ = local_d8._4_4_;
    auVar12._12_4_ = 0;
    auVar25 = divps(auVar30,auVar12);
    fVar17 = auVar25._4_4_;
    iVar10 = -(uint)(auVar25._0_4_ < 1.0);
    iVar13 = -(uint)(fVar17 < 0.0);
    auVar22._4_4_ = iVar13;
    auVar22._0_4_ = iVar10;
    auVar22._8_4_ = iVar13;
    auVar22._12_4_ = iVar13;
    auVar21._8_8_ = auVar22._8_8_;
    auVar21._4_4_ = iVar10;
    auVar21._0_4_ = iVar10;
    uVar11 = movmskpd((int)CONCAT71(extraout_var,bVar4),auVar21);
    fVar14 = 0.0;
    if (((uVar11 & 2) == 0) && (fVar14 = 1.0, fVar17 <= 1.0)) {
      fVar14 = fVar17;
    }
    _local_108 = ZEXT416((uint)((fVar14 * ((float)local_d8 - local_e8)) / (float)local_d8));
    if (((uVar11 & 1) != 0) && (held != false)) {
      local_78 = ZEXT416((uint)fVar27);
      fStack_54 = local_d8._4_4_;
      fStack_50 = fStack_d0;
      fStack_4c = fStack_cc;
      local_b8 = (undefined1  [8])&this->Scroll;
      pIVar8 = (ImRect *)(local_128 + 4);
      if (direction == 1) {
        pIVar8 = (ImRect *)local_128;
      }
      uVar2 = (ulong)(direction != 1);
      local_68 = ZEXT416((uint)(*(float *)((pIVar3->IO).MouseDown + uVar2 * 4 + -8) -
                               (pIVar8->Min).x));
      local_c8 = auVar25;
      local_58 = (float)local_d8 - local_e8;
      SetHoveredID(IVar5);
      fVar14 = (float)local_68._0_4_ / (float)local_d8;
      fVar27 = 1.0;
      if (fVar14 <= 1.0) {
        fVar27 = fVar14;
      }
      fVar27 = (float)(~-(uint)(fVar14 < 0.0) & (uint)fVar27);
      if (local_10c == (float)IVar5) {
        fVar14 = (&(pIVar3->ScrollbarClickDeltaToGrabCenter).x)[uVar2];
        bVar4 = false;
      }
      else if ((fVar27 < (float)local_108._0_4_) ||
              ((float)local_c8._0_4_ + (float)local_108._0_4_ < fVar27)) {
        (&(pIVar3->ScrollbarClickDeltaToGrabCenter).x)[uVar2] = 0.0;
        bVar4 = true;
        fVar14 = 0.0;
      }
      else {
        fVar14 = (float)local_c8._0_4_ * -0.5 + (fVar27 - (float)local_108._0_4_);
        (&(pIVar3->ScrollbarClickDeltaToGrabCenter).x)[uVar2] = fVar14;
        bVar4 = false;
      }
      fVar17 = ((fVar27 - fVar14) - (float)local_c8._0_4_ * 0.5) / (1.0 - (float)local_c8._0_4_);
      fVar14 = 1.0;
      if (fVar17 <= 1.0) {
        fVar14 = fVar17;
      }
      fVar14 = (float)(int)((float)(~-(uint)(fVar17 < 0.0) & (uint)fVar14) * (float)local_78._0_4_ +
                           0.5);
      auVar9 = local_b8;
      if (direction != 1) {
        auVar9 = (undefined1  [8])local_80;
      }
      *(float *)auVar9 = fVar14;
      fVar14 = fVar14 / (float)local_78._0_4_;
      fVar17 = 1.0;
      if (fVar14 <= 1.0) {
        fVar17 = fVar14;
      }
      fVar14 = (local_58 * (float)(~-(uint)(fVar14 < 0.0) & (uint)fVar17)) / (float)local_d8;
      local_108._4_4_ = fStack_54;
      local_108._0_4_ = fVar14;
      unique0x10000eb3 = fStack_50;
      unique0x10000eb7 = fStack_4c;
      if (bVar4) {
        (&(pIVar3->ScrollbarClickDeltaToGrabCenter).x)[uVar2] =
             -(float)local_c8._0_4_ * 0.5 + (fVar27 - fVar14);
      }
    }
    idx = 0x11;
    if (held == false) {
      idx = (hovered & 1) + 0xf;
    }
    IVar6 = GetColorU32(idx,1.0);
    if (direction == 1) {
      local_40.x = (float)local_128._0_4_ +
                   (aIStack_120[0].x - (float)local_128._0_4_) * (float)local_108._0_4_;
      local_38.x = local_e8 + local_40.x;
      local_40.y = (float)local_128._4_4_;
      local_38.y = aIStack_120[0].y;
      if ((float)local_98._0_4_ <= local_38.x) {
        local_38.x = (float)local_98._0_4_;
      }
    }
    else {
      local_40.y = (aIStack_120[0].y - (float)local_128._4_4_) * (float)local_108._0_4_ +
                   (float)local_128._4_4_;
      local_38.x = aIStack_120[0].x;
      local_40.x = (float)local_128._0_4_;
      local_38.y = local_e8 + local_40.y;
      if (local_a8 <= local_e8 + local_40.y) {
        local_38.y = local_a8;
      }
    }
    ImDrawList::AddRectFilled
              (this->DrawList,&local_40,&local_38,IVar6,(pIVar3->Style).ScrollbarRounding,0xf);
  }
  return;
}

Assistant:

void ImGui::Scrollbar(ImGuiLayoutType direction)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const bool horizontal = (direction == ImGuiLayoutType_Horizontal);
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(horizontal ? "#SCROLLX" : "#SCROLLY");

    // Render background
    bool other_scrollbar = (horizontal ? window->ScrollbarY : window->ScrollbarX);
    float other_scrollbar_size_w = other_scrollbar ? style.ScrollbarSize : 0.0f;
    const ImRect window_rect = window->Rect();
    const float border_size = window->WindowBorderSize;
    ImRect bb = horizontal
        ? ImRect(window->Pos.x + border_size, window_rect.Max.y - style.ScrollbarSize, window_rect.Max.x - other_scrollbar_size_w - border_size, window_rect.Max.y - border_size)
        : ImRect(window_rect.Max.x - style.ScrollbarSize, window->Pos.y + border_size, window_rect.Max.x - border_size, window_rect.Max.y - other_scrollbar_size_w - border_size);
    if (!horizontal)
        bb.Min.y += window->TitleBarHeight() + ((window->Flags & ImGuiWindowFlags_MenuBar) ? window->MenuBarHeight() : 0.0f);
    if (bb.GetWidth() <= 0.0f || bb.GetHeight() <= 0.0f)
        return;

    int window_rounding_corners;
    if (horizontal)
        window_rounding_corners = ImDrawCornerFlags_BotLeft | (other_scrollbar ? 0 : ImDrawCornerFlags_BotRight);
    else
        window_rounding_corners = (((window->Flags & ImGuiWindowFlags_NoTitleBar) && !(window->Flags & ImGuiWindowFlags_MenuBar)) ? ImDrawCornerFlags_TopRight : 0) | (other_scrollbar ? 0 : ImDrawCornerFlags_BotRight);
    window->DrawList->AddRectFilled(bb.Min, bb.Max, GetColorU32(ImGuiCol_ScrollbarBg), window->WindowRounding, window_rounding_corners);
    bb.Expand(ImVec2(-ImClamp((float)(int)((bb.Max.x - bb.Min.x - 2.0f) * 0.5f), 0.0f, 3.0f), -ImClamp((float)(int)((bb.Max.y - bb.Min.y - 2.0f) * 0.5f), 0.0f, 3.0f)));

    // V denote the main, longer axis of the scrollbar (= height for a vertical scrollbar)
    float scrollbar_size_v = horizontal ? bb.GetWidth() : bb.GetHeight();
    float scroll_v = horizontal ? window->Scroll.x : window->Scroll.y;
    float win_size_avail_v = (horizontal ? window->SizeFull.x : window->SizeFull.y) - other_scrollbar_size_w;
    float win_size_contents_v = horizontal ? window->SizeContents.x : window->SizeContents.y;

    // Calculate the height of our grabbable box. It generally represent the amount visible (vs the total scrollable amount)
    // But we maintain a minimum size in pixel to allow for the user to still aim inside.
    IM_ASSERT(ImMax(win_size_contents_v, win_size_avail_v) > 0.0f); // Adding this assert to check if the ImMax(XXX,1.0f) is still needed. PLEASE CONTACT ME if this triggers.
    const float win_size_v = ImMax(ImMax(win_size_contents_v, win_size_avail_v), 1.0f);
    const float grab_h_pixels = ImClamp(scrollbar_size_v * (win_size_avail_v / win_size_v), style.GrabMinSize, scrollbar_size_v);
    const float grab_h_norm = grab_h_pixels / scrollbar_size_v;

    // Handle input right away. None of the code of Begin() is relying on scrolling position before calling Scrollbar().
    bool held = false;
    bool hovered = false;
    const bool previously_held = (g.ActiveId == id);
    ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_NoNavFocus);

    float scroll_max = ImMax(1.0f, win_size_contents_v - win_size_avail_v);
    float scroll_ratio = ImSaturate(scroll_v / scroll_max);
    float grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;
    if (held && grab_h_norm < 1.0f)
    {
        float scrollbar_pos_v = horizontal ? bb.Min.x : bb.Min.y;
        float mouse_pos_v = horizontal ? g.IO.MousePos.x : g.IO.MousePos.y;
        float* click_delta_to_grab_center_v = horizontal ? &g.ScrollbarClickDeltaToGrabCenter.x : &g.ScrollbarClickDeltaToGrabCenter.y;

        // Click position in scrollbar normalized space (0.0f->1.0f)
        const float clicked_v_norm = ImSaturate((mouse_pos_v - scrollbar_pos_v) / scrollbar_size_v);
        SetHoveredID(id);

        bool seek_absolute = false;
        if (!previously_held)
        {
            // On initial click calculate the distance between mouse and the center of the grab
            if (clicked_v_norm >= grab_v_norm && clicked_v_norm <= grab_v_norm + grab_h_norm)
            {
                *click_delta_to_grab_center_v = clicked_v_norm - grab_v_norm - grab_h_norm*0.5f;
            }
            else
            {
                seek_absolute = true;
                *click_delta_to_grab_center_v = 0.0f;
            }
        }

        // Apply scroll
        // It is ok to modify Scroll here because we are being called in Begin() after the calculation of SizeContents and before setting up our starting position
        const float scroll_v_norm = ImSaturate((clicked_v_norm - *click_delta_to_grab_center_v - grab_h_norm*0.5f) / (1.0f - grab_h_norm));
        scroll_v = (float)(int)(0.5f + scroll_v_norm * scroll_max);//(win_size_contents_v - win_size_v));
        if (horizontal)
            window->Scroll.x = scroll_v;
        else
            window->Scroll.y = scroll_v;

        // Update values for rendering
        scroll_ratio = ImSaturate(scroll_v / scroll_max);
        grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;

        // Update distance to grab now that we have seeked and saturated
        if (seek_absolute)
            *click_delta_to_grab_center_v = clicked_v_norm - grab_v_norm - grab_h_norm*0.5f;
    }

    // Render
    const ImU32 grab_col = GetColorU32(held ? ImGuiCol_ScrollbarGrabActive : hovered ? ImGuiCol_ScrollbarGrabHovered : ImGuiCol_ScrollbarGrab);
    ImRect grab_rect;
    if (horizontal)
        grab_rect = ImRect(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm), bb.Min.y, ImMin(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm) + grab_h_pixels, window_rect.Max.x), bb.Max.y);
    else
        grab_rect = ImRect(bb.Min.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm), bb.Max.x, ImMin(ImLerp(bb.Min.y, bb.Max.y, grab_v_norm) + grab_h_pixels, window_rect.Max.y));
    window->DrawList->AddRectFilled(grab_rect.Min, grab_rect.Max, grab_col, style.ScrollbarRounding);
}